

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

void trad_enc_update_keys(trad_enc_ctx *ctx,uint8_t c)

{
  uLong uVar1;
  uchar local_12;
  uint8_t local_11;
  uint8_t t;
  trad_enc_ctx *ptStack_10;
  uint8_t c_local;
  trad_enc_ctx *ctx_local;
  
  local_11 = c;
  ptStack_10 = ctx;
  uVar1 = cm_zlib_z_crc32((ulong)ctx->keys[0] ^ 0xffffffff,&local_11,1);
  ptStack_10->keys[0] = (uint)uVar1 ^ 0xffffffff;
  ptStack_10->keys[1] = (ptStack_10->keys[1] + (ptStack_10->keys[0] & 0xff)) * 0x8088405 + 1;
  local_12 = (uchar)(ptStack_10->keys[1] >> 0x18);
  uVar1 = cm_zlib_z_crc32((ulong)ptStack_10->keys[2] ^ 0xffffffff,&local_12,1);
  ptStack_10->keys[2] = (uint)uVar1 ^ 0xffffffff;
  return;
}

Assistant:

static void
trad_enc_update_keys(struct trad_enc_ctx *ctx, uint8_t c)
{
	uint8_t t;
#define CRC32(c, b) (crc32(c ^ 0xffffffffUL, &b, 1) ^ 0xffffffffUL)

	ctx->keys[0] = CRC32(ctx->keys[0], c);
	ctx->keys[1] = (ctx->keys[1] + (ctx->keys[0] & 0xff)) * 134775813L + 1;
	t = (ctx->keys[1] >> 24) & 0xff;
	ctx->keys[2] = CRC32(ctx->keys[2], t);
#undef CRC32
}